

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O1

char * get_ea_mode_str(uint instruction,uint size)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  undefined8 uVar10;
  ulong uVar11;
  uint uVar12;
  char base_reg [4];
  char index_reg [8];
  undefined2 local_44;
  undefined1 local_42;
  char local_40 [8];
  uint local_38;
  uint local_34;
  
  pcVar5 = get_ea_mode_str::b2;
  if (get_ea_mode_str::mode != get_ea_mode_str::b1) {
    pcVar5 = get_ea_mode_str::b1;
  }
  uVar11 = (ulong)(instruction & 0x3f);
  get_ea_mode_str::mode = pcVar5;
  switch(uVar11) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    pcVar8 = "D%d";
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    pcVar8 = "A%d";
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
    pcVar8 = "(A%d)";
    break;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    pcVar8 = "(A%d)+";
    break;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    pcVar8 = "-(A%d)";
    break;
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    uVar2 = dasm_read_imm_16(instruction);
    make_signed_hex_str_16(uVar2);
    sprintf(pcVar5,"(%s,A%d)",make_signed_hex_str_16::str,(ulong)(instruction & 7));
    return get_ea_mode_str::mode;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
    uVar9 = instruction;
    uVar2 = dasm_read_imm_16(instruction);
    pcVar5 = get_ea_mode_str::mode;
    if ((uVar2 >> 8 & 1) == 0) {
      if ((char)uVar2 == '\0') {
        uVar10 = 0x6c;
        if ((uVar2 >> 0xb & 1) == 0) {
          uVar10 = 0x77;
        }
        sprintf(get_ea_mode_str::mode,"(A%d,%c%d.%c",(ulong)(instruction & 7),
                (ulong)((uint)(uVar2 < 0x8000) * 3 + 0x41),(ulong)(uVar2 >> 0xc & 7),uVar10);
      }
      else {
        make_signed_hex_str_8(uVar2);
        uVar4 = instruction & 7;
        uVar9 = (uint)(uVar2 < 0x8000) * 3 + 0x41;
        uVar11 = (ulong)(uVar2 >> 0xc & 7);
        pcVar8 = "(%s,A%d,%c%d.%c";
LAB_0040124e:
        sprintf(pcVar5,pcVar8,make_signed_hex_str_8::str,(ulong)uVar4,(ulong)uVar9,uVar11);
      }
LAB_00401300:
      pcVar5 = get_ea_mode_str::mode;
      uVar2 = uVar2 >> 9 & 3;
      if (uVar2 != 0) {
        sVar3 = strlen(get_ea_mode_str::mode);
        sprintf(pcVar5 + sVar3,"*%d",(ulong)(uint)(1 << (sbyte)uVar2));
      }
      goto LAB_004016bb;
    }
    if ((uVar2 & 0xe4) == 0xc4 || (uVar2 & 0xe2) == 0xc0) {
LAB_0040127e:
      pcVar5 = get_ea_mode_str::mode;
      pcVar5[0] = '0';
      pcVar5[1] = '\0';
      return get_ea_mode_str::mode;
    }
    uVar6 = uVar2 & 0x30;
    uVar7 = 0;
    uVar4 = 0;
    if (0x10 < uVar6) {
      if (uVar6 == 0x30) {
        uVar4 = dasm_read_imm_32(uVar9);
      }
      else {
        uVar4 = dasm_read_imm_16(uVar9);
      }
    }
    uVar12 = uVar2 & 3;
    local_38 = uVar2 & 0x44;
    if (local_38 != 0x44 && 1 < uVar12) {
      if (uVar12 == 3) {
        uVar7 = dasm_read_imm_32(uVar9);
      }
      else {
        uVar7 = dasm_read_imm_16(uVar9);
      }
    }
    if ((char)uVar2 < '\0') {
      local_44 = local_44 & 0xff00;
    }
    else {
      sprintf((char *)&local_44,"A%d",(ulong)(instruction & 7));
    }
    local_34 = uVar7;
    if ((uVar2 & 0x40) == 0) {
      uVar10 = 0x6c;
      if ((uVar2 >> 0xb & 1) == 0) {
        uVar10 = 0x77;
      }
      sprintf(local_40,"%c%d.%c",(ulong)((uint)(uVar2 < 0x8000) * 3 + 0x41),
              (ulong)(uVar2 >> 0xc & 7),uVar10);
      uVar9 = uVar2 >> 9 & 3;
      if (uVar9 != 0) {
        sVar3 = strlen(local_40);
        sprintf(local_40 + sVar3,"*%d",(ulong)(uint)(1 << (sbyte)uVar9));
      }
    }
    else {
      local_40[0] = '\0';
    }
    pcVar5 = get_ea_mode_str::mode;
    uVar2 = uVar2 & 7;
    uVar9 = uVar2 - 1;
    pcVar5[0] = '(';
    pcVar5[1] = '\0';
    if (4 < uVar2 || uVar9 < 3) {
      sVar3 = strlen(pcVar5);
      (pcVar5 + sVar3)[0] = '[';
      (pcVar5 + sVar3)[1] = '\0';
    }
    if (uVar4 == 0) {
      bVar1 = false;
    }
    else {
      if (uVar6 == 0x30) {
        make_signed_hex_str_32(uVar4);
        pcVar8 = make_signed_hex_str_32::str;
      }
      else {
        make_signed_hex_str_16(uVar4);
        pcVar8 = make_signed_hex_str_16::str;
      }
      strcat(pcVar5,pcVar8);
      bVar1 = true;
    }
    pcVar5 = get_ea_mode_str::mode;
    goto joined_r0x004018ab;
  case 0x38:
    uVar2 = dasm_read_imm_16(instruction);
    pcVar8 = "$%x.w";
    goto LAB_004013e3;
  case 0x39:
    uVar2 = dasm_read_imm_32(instruction);
    pcVar8 = "$%x.l";
LAB_004013e3:
    uVar11 = (ulong)uVar2;
    goto LAB_00401197;
  case 0x3a:
    uVar2 = dasm_read_imm_16(instruction);
    pcVar5 = get_ea_mode_str::mode;
    make_signed_hex_str_16(uVar2);
    sprintf(pcVar5,"(%s,PC)",make_signed_hex_str_16::str);
    uVar11 = (ulong)((g_cpu_pc + (uint)(uVar2 < 0x8000) * 0x10000 + uVar2) - 0x10002);
    pcVar5 = g_helper_str;
    pcVar8 = "; ($%x)";
    goto LAB_00401197;
  case 0x3b:
    uVar2 = dasm_read_imm_16(instruction);
    pcVar5 = get_ea_mode_str::mode;
    if ((uVar2 >> 8 & 1) == 0) {
      if ((char)uVar2 != '\0') {
        make_signed_hex_str_8(uVar2);
        uVar4 = (uint)(uVar2 < 0x8000) * 3 + 0x41;
        uVar9 = uVar2 >> 0xc & 7;
        uVar11 = 0x6c;
        if ((uVar2 >> 0xb & 1) == 0) {
          uVar11 = 0x77;
        }
        pcVar8 = "(%s,PC,%c%d.%c";
        goto LAB_0040124e;
      }
      uVar10 = 0x6c;
      if ((uVar2 >> 0xb & 1) == 0) {
        uVar10 = 0x77;
      }
      sprintf(get_ea_mode_str::mode,"(PC,%c%d.%c",(ulong)((uint)(uVar2 < 0x8000) * 3 + 0x41),
              (ulong)(uVar2 >> 0xc & 7),uVar10);
      goto LAB_00401300;
    }
    if ((uVar2 & 0xe4) == 0xc4 || (uVar2 & 0xe2) == 0xc0) goto LAB_0040127e;
    uVar7 = uVar2 & 0x30;
    uVar9 = 0;
    uVar4 = 0;
    if (0x10 < uVar7) {
      if (uVar7 == 0x30) {
        uVar4 = dasm_read_imm_32(instruction);
      }
      else {
        uVar4 = dasm_read_imm_16(instruction);
      }
    }
    uVar12 = uVar2 & 3;
    local_38 = uVar2 & 0x44;
    if (local_38 != 0x44 && 1 < uVar12) {
      if (uVar12 == 3) {
        uVar9 = dasm_read_imm_32(instruction);
      }
      else {
        uVar9 = dasm_read_imm_16(instruction);
      }
    }
    if ((char)uVar2 < '\0') {
      local_44 = (ushort)local_44._1_1_ << 8;
    }
    else {
      local_42 = 0;
      local_44 = 0x4350;
    }
    local_34 = uVar9;
    if ((uVar2 & 0x40) == 0) {
      uVar10 = 0x6c;
      if ((uVar2 >> 0xb & 1) == 0) {
        uVar10 = 0x77;
      }
      sprintf(local_40,"%c%d.%c",(ulong)((uint)(uVar2 < 0x8000) * 3 + 0x41),
              (ulong)(uVar2 >> 0xc & 7),uVar10);
      uVar9 = uVar2 >> 9 & 3;
      if (uVar9 != 0) {
        sVar3 = strlen(local_40);
        sprintf(local_40 + sVar3,"*%d",(ulong)(uint)(1 << (sbyte)uVar9));
      }
    }
    else {
      local_40[0] = '\0';
    }
    pcVar5 = get_ea_mode_str::mode;
    uVar2 = uVar2 & 7;
    uVar9 = uVar2 - 1;
    pcVar5[0] = '(';
    pcVar5[1] = '\0';
    if (4 < uVar2 || uVar9 < 3) {
      sVar3 = strlen(pcVar5);
      (pcVar5 + sVar3)[0] = '[';
      (pcVar5 + sVar3)[1] = '\0';
    }
    if (uVar4 == 0) {
      bVar1 = false;
    }
    else {
      if (uVar7 == 0x30) {
        make_signed_hex_str_32(uVar4);
        pcVar8 = make_signed_hex_str_32::str;
      }
      else {
        make_signed_hex_str_16(uVar4);
        pcVar8 = make_signed_hex_str_16::str;
      }
      strcat(pcVar5,pcVar8);
      bVar1 = true;
    }
    pcVar5 = get_ea_mode_str::mode;
joined_r0x004018ab:
    get_ea_mode_str::mode = pcVar5;
    if ((char)local_44 != '\0') {
      if (uVar4 != 0) {
        sVar3 = strlen(pcVar5);
        (pcVar5 + sVar3)[0] = ',';
        (pcVar5 + sVar3)[1] = '\0';
      }
      strcat(get_ea_mode_str::mode,(char *)&local_44);
      bVar1 = true;
    }
    pcVar5 = get_ea_mode_str::mode;
    if (4 < uVar2) {
      sVar3 = strlen(get_ea_mode_str::mode);
      (pcVar5 + sVar3)[0] = ']';
      (pcVar5 + sVar3)[1] = '\0';
      bVar1 = true;
    }
    pcVar5 = get_ea_mode_str::mode;
    if (local_40[0] != '\0') {
      if (bVar1) {
        sVar3 = strlen(get_ea_mode_str::mode);
        (pcVar5 + sVar3)[0] = ',';
        (pcVar5 + sVar3)[1] = '\0';
      }
      strcat(get_ea_mode_str::mode,local_40);
      bVar1 = true;
    }
    pcVar5 = get_ea_mode_str::mode;
    if (uVar9 < 3) {
      sVar3 = strlen(get_ea_mode_str::mode);
      (pcVar5 + sVar3)[0] = ']';
      (pcVar5 + sVar3)[1] = '\0';
      bVar1 = true;
    }
    uVar2 = local_34;
    pcVar5 = get_ea_mode_str::mode;
    if (local_34 != 0) {
      if (bVar1) {
        sVar3 = strlen(get_ea_mode_str::mode);
        (pcVar5 + sVar3)[0] = ',';
        (pcVar5 + sVar3)[1] = '\0';
      }
      pcVar5 = get_ea_mode_str::mode;
      if (uVar12 == 3 && local_38 != 0x44) {
        make_signed_hex_str_32(uVar2);
        pcVar8 = make_signed_hex_str_32::str;
      }
      else {
        make_signed_hex_str_16(uVar2);
        pcVar8 = make_signed_hex_str_16::str;
      }
      strcat(pcVar5,pcVar8);
    }
LAB_004016bb:
    pcVar5 = get_ea_mode_str::mode;
    sVar3 = strlen(get_ea_mode_str::mode);
    (pcVar5 + sVar3)[0] = ')';
    (pcVar5 + sVar3)[1] = '\0';
    return get_ea_mode_str::mode;
  case 0x3c:
    get_imm_str_u(size);
    strcpy(pcVar5,get_imm_str_u::str);
    return get_ea_mode_str::mode;
  default:
    pcVar8 = "INVALID $%x";
    goto LAB_00401197;
  }
  uVar11 = (ulong)(instruction & 7);
LAB_00401197:
  sprintf(pcVar5,pcVar8,uVar11);
  return get_ea_mode_str::mode;
}

Assistant:

static char* get_ea_mode_str(uint instruction, uint size)
{
	static char b1[64];
	static char b2[64];
	static char* mode = b2;
	uint extension;
	uint base;
	uint outer;
	char base_reg[4];
	char index_reg[8];
	uint preindex;
	uint postindex;
	uint comma = 0;
	uint temp_value;

	/* Switch buffers so we don't clobber on a double-call to this function */
	mode = mode == b1 ? b2 : b1;

	switch(instruction & 0x3f)
	{
		case 0x00: case 0x01: case 0x02: case 0x03: case 0x04: case 0x05: case 0x06: case 0x07:
		/* data register direct */
			sprintf(mode, "D%d", instruction&7);
			break;
		case 0x08: case 0x09: case 0x0a: case 0x0b: case 0x0c: case 0x0d: case 0x0e: case 0x0f:
		/* address register direct */
			sprintf(mode, "A%d", instruction&7);
			break;
		case 0x10: case 0x11: case 0x12: case 0x13: case 0x14: case 0x15: case 0x16: case 0x17:
		/* address register indirect */
			sprintf(mode, "(A%d)", instruction&7);
			break;
		case 0x18: case 0x19: case 0x1a: case 0x1b: case 0x1c: case 0x1d: case 0x1e: case 0x1f:
		/* address register indirect with postincrement */
			sprintf(mode, "(A%d)+", instruction&7);
			break;
		case 0x20: case 0x21: case 0x22: case 0x23: case 0x24: case 0x25: case 0x26: case 0x27:
		/* address register indirect with predecrement */
			sprintf(mode, "-(A%d)", instruction&7);
			break;
		case 0x28: case 0x29: case 0x2a: case 0x2b: case 0x2c: case 0x2d: case 0x2e: case 0x2f:
		/* address register indirect with displacement*/
			sprintf(mode, "(%s,A%d)", make_signed_hex_str_16(read_imm_16()), instruction&7);
			break;
		case 0x30: case 0x31: case 0x32: case 0x33: case 0x34: case 0x35: case 0x36: case 0x37:
		/* address register indirect with index */
			extension = read_imm_16();

			if(EXT_FULL(extension))
			{
				if(EXT_EFFECTIVE_ZERO(extension))
				{
					strcpy(mode, "0");
					break;
				}
				base = EXT_BASE_DISPLACEMENT_PRESENT(extension) ? (EXT_BASE_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				outer = EXT_OUTER_DISPLACEMENT_PRESENT(extension) ? (EXT_OUTER_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				if(EXT_BASE_REGISTER_PRESENT(extension))
					sprintf(base_reg, "A%d", instruction&7);
				else
					*base_reg = 0;
				if(EXT_INDEX_REGISTER_PRESENT(extension))
				{
					sprintf(index_reg, "%c%d.%c", EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
					if(EXT_INDEX_SCALE(extension))
						sprintf(index_reg+strlen(index_reg), "*%d", 1 << EXT_INDEX_SCALE(extension));
				}
				else
					*index_reg = 0;
				preindex = (extension&7) > 0 && (extension&7) < 4;
				postindex = (extension&7) > 4;

				strcpy(mode, "(");
				if(preindex || postindex)
					strcat(mode, "[");
				if(base)
				{
					if (EXT_BASE_DISPLACEMENT_LONG(extension))
					{
						strcat(mode, make_signed_hex_str_32(base));
					}
					else
					{
						strcat(mode, make_signed_hex_str_16(base));
					}
					comma = 1;
				}
				if(*base_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, base_reg);
					comma = 1;
				}
				if(postindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(*index_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, index_reg);
					comma = 1;
				}
				if(preindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(outer)
				{
					if(comma)
						strcat(mode, ",");
                    if (EXT_OUTER_DISPLACEMENT_LONG(extension)) {
                        strcat(mode, make_signed_hex_str_32(outer));
                    } else {
                        strcat(mode, make_signed_hex_str_16(outer));
                    }
				}
				strcat(mode, ")");
				break;
			}

			if(EXT_8BIT_DISPLACEMENT(extension) == 0)
				sprintf(mode, "(A%d,%c%d.%c", instruction&7, EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			else
				sprintf(mode, "(%s,A%d,%c%d.%c", make_signed_hex_str_8(extension), instruction&7, EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			if(EXT_INDEX_SCALE(extension))
				sprintf(mode+strlen(mode), "*%d", 1 << EXT_INDEX_SCALE(extension));
			strcat(mode, ")");
			break;
		case 0x38:
		/* absolute short address */
			sprintf(mode, "$%x.w", read_imm_16());
			break;
		case 0x39:
		/* absolute long address */
			sprintf(mode, "$%x.l", read_imm_32());
			break;
		case 0x3a:
		/* program counter with displacement */
			temp_value = read_imm_16();
			sprintf(mode, "(%s,PC)", make_signed_hex_str_16(temp_value));
			sprintf(g_helper_str, "; ($%x)", (make_int_16(temp_value) + g_cpu_pc-2) & 0xffffffff);
			break;
		case 0x3b:
		/* program counter with index */
			extension = read_imm_16();

			if(EXT_FULL(extension))
			{
				if(EXT_EFFECTIVE_ZERO(extension))
				{
					strcpy(mode, "0");
					break;
				}
				base = EXT_BASE_DISPLACEMENT_PRESENT(extension) ? (EXT_BASE_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				outer = EXT_OUTER_DISPLACEMENT_PRESENT(extension) ? (EXT_OUTER_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				if(EXT_BASE_REGISTER_PRESENT(extension))
					strcpy(base_reg, "PC");
				else
					*base_reg = 0;
				if(EXT_INDEX_REGISTER_PRESENT(extension))
				{
					sprintf(index_reg, "%c%d.%c", EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
					if(EXT_INDEX_SCALE(extension))
						sprintf(index_reg+strlen(index_reg), "*%d", 1 << EXT_INDEX_SCALE(extension));
				}
				else
					*index_reg = 0;
				preindex = (extension&7) > 0 && (extension&7) < 4;
				postindex = (extension&7) > 4;

				strcpy(mode, "(");
				if(preindex || postindex)
					strcat(mode, "[");
                if(base)
                {
                    if (EXT_BASE_DISPLACEMENT_LONG(extension))
                    {
                        strcat(mode, make_signed_hex_str_32(base));
                    }
                    else
                    {
                        strcat(mode, make_signed_hex_str_16(base));
                    }
					comma = 1;
				}
				if(*base_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, base_reg);
					comma = 1;
				}
				if(postindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(*index_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, index_reg);
					comma = 1;
				}
				if(preindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(outer)
				{
					if(comma)
						strcat(mode, ",");
                    if (EXT_OUTER_DISPLACEMENT_LONG(extension)) {
                        strcat(mode, make_signed_hex_str_32(outer));
                    } else {
                        strcat(mode, make_signed_hex_str_16(outer));
                    }
				}
				strcat(mode, ")");
				break;
			}

			if(EXT_8BIT_DISPLACEMENT(extension) == 0)
				sprintf(mode, "(PC,%c%d.%c", EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			else
				sprintf(mode, "(%s,PC,%c%d.%c", make_signed_hex_str_8(extension), EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			if(EXT_INDEX_SCALE(extension))
				sprintf(mode+strlen(mode), "*%d", 1 << EXT_INDEX_SCALE(extension));
			strcat(mode, ")");
			break;
		case 0x3c:
		/* Immediate */
			sprintf(mode, "%s", get_imm_str_u(size));
			break;
		default:
			sprintf(mode, "INVALID $%x", instruction & 0x3f);
	}
	return mode;
}